

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void groupConcatStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  u32 uVar2;
  int iVar3;
  sqlite3_value *psVar4;
  int iVar5;
  int iVar6;
  sqlite3_str *p;
  char *pcVar7;
  ulong uVar8;
  
  psVar4 = *argv;
  uVar1._0_2_ = psVar4->flags;
  uVar1._2_1_ = psVar4->enc;
  uVar1._3_1_ = psVar4->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
    return;
  }
  if ((short)context->pMem->flags < 0) {
    p = (sqlite3_str *)context->pMem->z;
  }
  else {
    p = (sqlite3_str *)createAggContext(context,0x30);
  }
  if (p == (sqlite3_str *)0x0) {
    return;
  }
  uVar2 = p->mxAlloc;
  p->mxAlloc = context->pOut->db->aLimit[0];
  if (argc == 1) {
    if (uVar2 == 0) {
      *(undefined4 *)((long)&p[1].db + 4) = 1;
    }
    else {
      sqlite3_str_appendchar(p,1,',');
    }
    goto LAB_001b81c3;
  }
  if (uVar2 == 0) {
    iVar6 = sqlite3ValueBytes(argv[1],'\x01');
    *(int *)((long)&p[1].db + 4) = iVar6;
    goto LAB_001b81c3;
  }
  pcVar7 = (char *)sqlite3ValueText(argv[1],'\x01');
  iVar6 = sqlite3ValueBytes(argv[1],'\x01');
  if (pcVar7 == (char *)0x0) {
    iVar6 = 0;
  }
  else {
    sqlite3_str_append(p,pcVar7,iVar6);
  }
  if ((iVar6 == *(int *)((long)&p[1].db + 4)) && (p[1].zText == (char *)0x0)) goto LAB_001b81c3;
  pcVar7 = p[1].zText;
  iVar3 = *(int *)&p[1].db;
  iVar5 = sqlite3_initialize();
  if (pcVar7 == (char *)0x0) {
    if (iVar5 == 0) {
      pcVar7 = (char *)sqlite3Malloc((long)iVar3 * 4 + 4);
    }
    else {
      pcVar7 = (char *)0x0;
    }
    if (pcVar7 == (char *)0x0) goto LAB_001b8195;
    iVar3 = *(int *)&p[1].db;
    if (1 < iVar3) {
      uVar8 = 0;
      do {
        *(undefined4 *)(pcVar7 + uVar8 * 4) = *(undefined4 *)((long)&p[1].db + 4);
        uVar8 = uVar8 + 1;
      } while (iVar3 - 1 != uVar8);
    }
  }
  else if (iVar5 == 0) {
    pcVar7 = (char *)sqlite3Realloc(pcVar7,(long)iVar3 << 2);
  }
  else {
LAB_001b8195:
    pcVar7 = (char *)0x0;
  }
  if (pcVar7 == (char *)0x0) {
    p->accError = '\a';
    if (p->mxAlloc != 0) {
      sqlite3_str_reset(p);
    }
  }
  else {
    if (0 < *(int *)&p[1].db) {
      *(int *)(pcVar7 + (ulong)(*(int *)&p[1].db - 1) * 4) = iVar6;
    }
    p[1].zText = pcVar7;
  }
LAB_001b81c3:
  *(int *)&p[1].db = *(int *)&p[1].db + 1;
  pcVar7 = (char *)sqlite3ValueText(*argv,'\x01');
  iVar6 = sqlite3ValueBytes(*argv,'\x01');
  if (pcVar7 == (char *)0x0) {
    return;
  }
  sqlite3_str_append(p,pcVar7,iVar6);
  return;
}

Assistant:

static void groupConcatStep(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zVal;
  GroupConcatCtx *pGCC;
  const char *zSep;
  int nVal, nSep;
  assert( argc==1 || argc==2 );
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pGCC = (GroupConcatCtx*)sqlite3_aggregate_context(context, sizeof(*pGCC));
  if( pGCC ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    int firstTerm = pGCC->str.mxAlloc==0;
    pGCC->str.mxAlloc = db->aLimit[SQLITE_LIMIT_LENGTH];
    if( argc==1 ){
      if( !firstTerm ){
        sqlite3_str_appendchar(&pGCC->str, 1, ',');
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      else{
        pGCC->nFirstSepLength = 1;
      }
#endif
    }else if( !firstTerm ){
      zSep = (char*)sqlite3_value_text(argv[1]);
      nSep = sqlite3_value_bytes(argv[1]);
      if( zSep ){
        sqlite3_str_append(&pGCC->str, zSep, nSep);
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      else{
        nSep = 0;
      }
      if( nSep != pGCC->nFirstSepLength || pGCC->pnSepLengths != 0 ){
        int *pnsl = pGCC->pnSepLengths;
        if( pnsl == 0 ){
          /* First separator length variation seen, start tracking them. */
          pnsl = (int*)sqlite3_malloc64((pGCC->nAccum+1) * sizeof(int));
          if( pnsl!=0 ){
            int i = 0, nA = pGCC->nAccum-1;
            while( i<nA ) pnsl[i++] = pGCC->nFirstSepLength;
          }
        }else{
          pnsl = (int*)sqlite3_realloc64(pnsl, pGCC->nAccum * sizeof(int));
        }
        if( pnsl!=0 ){
          if( ALWAYS(pGCC->nAccum>0) ){
            pnsl[pGCC->nAccum-1] = nSep;
          }
          pGCC->pnSepLengths = pnsl;
        }else{
          sqlite3StrAccumSetError(&pGCC->str, SQLITE_NOMEM);
        }
      }
#endif
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    else{
      pGCC->nFirstSepLength = sqlite3_value_bytes(argv[1]);
    }
    pGCC->nAccum += 1;
#endif
    zVal = (char*)sqlite3_value_text(argv[0]);
    nVal = sqlite3_value_bytes(argv[0]);
    if( zVal ) sqlite3_str_append(&pGCC->str, zVal, nVal);
  }
}